

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

HRESULT __thiscall
Js::SourceTextModuleRecord::PrepareForModuleDeclarationInitialization(SourceTextModuleRecord *this)

{
  Var pvVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  JavascriptString *pJVar7;
  undefined4 extraout_var;
  undefined4 *puVar9;
  undefined4 extraout_var_00;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  char16_t *pcVar8;
  
  pvVar1 = (this->normalizedSpecifier).ptr;
  if (pvVar1 == (Var)0x0) {
    pcVar8 = L"module";
  }
  else {
    pJVar7 = VarTo<Js::JavascriptString>(pvVar1);
    iVar5 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
    pcVar8 = (char16_t *)CONCAT44(extraout_var,iVar5);
  }
  iVar5 = 0;
  Output::TraceWithFlush(ModulePhase,L"PrepareForModuleDeclarationInitialization(%s)\n",pcVar8);
  bVar4 = ConfirmChildrenParsed(this);
  if (bVar4) {
    iVar5 = 0;
    Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentsAsNeeded\n");
    NotifyParentsAsNeeded(this);
    if ((this->wasDeclarationInitialized == false) &&
       ((this->isRootModule != false || ((this->promise).ptr != (JavascriptPromise *)0x0)))) {
      scriptContext = (this->scriptContext).ptr;
      if ((scriptContext->threadContext->isScriptActive == true) &&
         ((this->promise).ptr == (JavascriptPromise *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x179,
                                    "(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr)"
                                    ,
                                    "!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr"
                                   );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      iVar6 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])(this);
      if ((char)iVar6 != '\0') {
        (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0xb])(this);
      }
      if ((this->errorObject).ptr != (void *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
      }
      if ((this->hadNotifyHostReady == false) &&
         ((this->super_ModuleRecordBase).wasEvaluated == false)) {
        pvVar1 = (this->normalizedSpecifier).ptr;
        if (pvVar1 == (Var)0x0) {
          pcVar8 = L"module";
        }
        else {
          pJVar7 = VarTo<Js::JavascriptString>(pvVar1);
          iVar5 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar7);
          pcVar8 = (char16_t *)CONCAT44(extraout_var_00,iVar5);
        }
        Output::TraceWithFlush
                  (ModulePhase,
                   L"\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"
                   ,pcVar8);
        if (scriptContext->threadContext->isScriptActive == true) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,
                     &stack0xfffffffffffffff8);
          pTVar2 = scriptContext->threadContext;
          bVar4 = pTVar2->reentrancySafeOrHandled;
          pTVar2->reentrancySafeOrHandled = true;
          iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
          pTVar2->reentrancySafeOrHandled = bVar4;
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58);
        }
        else {
          local_58._0_4_ = ExceptionCheck::Save();
          iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ExceptionCheck::Restore((Data *)local_58);
        }
        this->hadNotifyHostReady = true;
      }
    }
  }
  return iVar5;
}

Assistant:

HRESULT SourceTextModuleRecord::PrepareForModuleDeclarationInitialization()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("PrepareForModuleDeclarationInitialization(%s)\n"), this->GetSpecifierSz());
        HRESULT hr = NO_ERROR;

        if (ConfirmChildrenParsed())
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentsAsNeeded\n"));
            NotifyParentsAsNeeded();

            if (!WasDeclarationInitialized() && (isRootModule || promise != nullptr))
            {
                // TODO: move this as a promise call? if parser is called from a different thread
                // We'll need to call the bytecode gen in the main thread as we are accessing GC.
                ScriptContext* scriptContext = GetScriptContext();
                Assert(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr);

                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                }

                if (!hadNotifyHostReady && !WasEvaluated())
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"), this->GetSpecifierSz());
                    LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                    {
                        hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                    });

                    hadNotifyHostReady = true;
                }
            }
        }
        return hr;
    }